

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeReturn(Ref value)

{
  char cVar1;
  Ref RVar2;
  Ref r;
  Value *this;
  Ref local_20;
  Ref value_local;
  
  local_20.inst = value.inst;
  RVar2 = makeRawArray(2);
  r = makeRawString((IString *)&RETURN);
  this = Value::push_back(RVar2.inst,r);
  cVar1 = cashew::Ref::operator!(&local_20);
  RVar2.inst = local_20.inst;
  if (cVar1 != '\0') {
    RVar2 = makeNull();
  }
  RVar2.inst = Value::push_back(this,RVar2);
  return (Ref)RVar2.inst;
}

Assistant:

static Ref makeReturn(Ref value) {
    return &makeRawArray(2)
              ->push_back(makeRawString(RETURN))
              .push_back(!!value ? value : makeNull());
  }